

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O0

bool Kernel::MatchingUtils::
     matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
               (Term *base,Term *instance,Binder *binder)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Term *this;
  Term *this_00;
  ulong in_RCX;
  Stack<Kernel::TermList_*> *in_RDX;
  Term *in_RSI;
  Term *in_RDI;
  Term *t;
  Term *s;
  TermList *it;
  TermList *bt;
  Literal *l2;
  Literal *l1;
  Binder *in_stack_ffffffffffffff48;
  TermList in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Stack<Kernel::TermList_*> *in_stack_ffffffffffffff60;
  Literal *in_stack_ffffffffffffff68;
  Binder *in_stack_ffffffffffffff78;
  TermList in_stack_ffffffffffffff80;
  TermList in_stack_ffffffffffffff88;
  TermList *local_50;
  TermList *local_48;
  
  bVar1 = Term::shared((Term *)0x44362c);
  if ((bVar1) && (bVar1 = Term::shared((Term *)0x44363f), bVar1)) {
    uVar4 = Term::weight(in_RDI);
    uVar3 = Term::weight(in_RSI);
    in_RCX = (ulong)uVar3;
    if (uVar3 < uVar4) {
      return false;
    }
  }
  bVar1 = Term::isLiteral((Term *)0x443689);
  if ((bVar1) && (bVar1 = Term::isTwoVarEquality(in_RDI), bVar1)) {
    Literal::twoVarEqSort((Literal *)in_RDI);
    SortHelper::getEqualityArgumentSort(in_stack_ffffffffffffff68);
    bVar1 = matchTerms<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
    if (!bVar1) {
      return false;
    }
  }
  local_48 = Term::args(in_RDI);
  local_50 = Term::args(in_RSI);
  if ((matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder&)
       ::subterms == '\0') &&
     (iVar2 = __cxa_guard_acquire(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder&)
                                   ::subterms), iVar2 != 0)) {
    Lib::Stack<Kernel::TermList_*>::Stack
              (in_stack_ffffffffffffff60,
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,
                 &matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                  ::subterms,&__dso_handle);
    __cxa_guard_release(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder&)
                         ::subterms);
  }
  Lib::Stack<Kernel::TermList_*>::reset
            (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
              ::subterms);
  do {
    while( true ) {
      TermList::next(local_48);
      bVar1 = TermList::isEmpty((TermList *)0x4437ae);
      if (!bVar1) {
        TermList::next(local_50);
        Lib::Stack<Kernel::TermList_*>::push
                  ((Stack<Kernel::TermList_*> *)in_stack_ffffffffffffff50._content,
                   (TermList *)in_stack_ffffffffffffff48);
        TermList::next(local_48);
        Lib::Stack<Kernel::TermList_*>::push
                  ((Stack<Kernel::TermList_*> *)in_stack_ffffffffffffff50._content,
                   (TermList *)in_stack_ffffffffffffff48);
      }
      bVar1 = TermList::isSpecialVar((TermList *)0x44380f);
      if (!bVar1) break;
      TermList::var(local_48);
      Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder
      ::specVar(in_stack_ffffffffffffff48,0,in_stack_ffffffffffffff50);
LAB_00443a2f:
      bVar1 = Lib::Stack<Kernel::TermList_*>::isEmpty
                        (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                          ::subterms);
      if (bVar1) {
        return true;
      }
      local_48 = Lib::Stack<Kernel::TermList_*>::pop
                           (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                             ::subterms);
      local_50 = Lib::Stack<Kernel::TermList_*>::pop
                           (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                             ::subterms);
    }
    bVar1 = TermList::isSpecialVar((TermList *)0x443859);
    if (bVar1) {
      TermList::var(local_50);
      Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder
      ::specVar(in_stack_ffffffffffffff48,0,in_stack_ffffffffffffff50);
      goto LAB_00443a2f;
    }
    bVar1 = TermList::isTerm((TermList *)0x4438a3);
    if (!bVar1) {
      in_stack_ffffffffffffff50._content = (uint64_t)in_RDX;
      uVar4 = TermList::var(local_48);
      uVar4 = Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher
              ::Binder::bind((Binder *)in_stack_ffffffffffffff50._content,uVar4,
                             (sockaddr *)local_50->_content,(socklen_t)in_RCX);
      if ((uVar4 & 1) == 0) {
        return false;
      }
      goto LAB_00443a2f;
    }
    bVar1 = TermList::isTerm((TermList *)0x4438b6);
    if (!bVar1) {
      return false;
    }
    this = TermList::term((TermList *)0x4438d1);
    this_00 = TermList::term((TermList *)0x4438e0);
    uVar4 = Term::functor(this);
    uVar3 = Term::functor(this_00);
    in_RCX = (ulong)uVar3;
    if (uVar4 != uVar3) {
      return false;
    }
    TermList::term((TermList *)0x44391e);
    bVar1 = Term::shared((Term *)0x443926);
    if (bVar1) {
      TermList::term((TermList *)0x443939);
      bVar1 = Term::shared((Term *)0x443941);
      if (bVar1) {
        TermList::term((TermList *)0x443951);
        bVar1 = Term::ground((Term *)0x443959);
        if ((bVar1) && (bVar1 = TermList::operator!=(local_48,local_50), bVar1)) {
          return false;
        }
        uVar4 = Term::weight(this);
        uVar3 = Term::weight(this_00);
        in_RCX = (ulong)uVar3;
        if (uVar3 < uVar4) {
          return false;
        }
      }
    }
    uVar4 = Term::arity(this);
    if (uVar4 == 0) goto LAB_00443a2f;
    local_48 = Term::args(this);
    local_50 = Term::args(this_00);
  } while( true );
}

Assistant:

bool MatchingUtils::matchArgs(Term* base, Term* instance, Binder& binder)
{
  ASS_EQ(base->functor(),instance->functor());
  if(base->shared() && instance->shared()) {
    if(base->weight() > instance->weight()) {
      return false;
    }
  }
  // Note: while this function only cares about the term structure,
  // for two-variable equalities we need to get the sort of the arguments from the Literal object.
  if(base->isLiteral() && static_cast<Literal*>(base)->isTwoVarEquality()){
    Literal* l1 = static_cast<Literal*>(base);
    Literal* l2 = static_cast<Literal*>(instance);
    if(!matchTerms(l1->twoVarEqSort(), SortHelper::getEqualityArgumentSort(l2), binder)){
      return false;
    }
  }
  ASS_G(base->arity(),0);

  TermList* bt=base->args();
  TermList* it=instance->args();

  static Stack<TermList*> subterms(32);
  subterms.reset();

  for (;;) {
    if (!bt->next()->isEmpty()) {
      subterms.push(it->next());
      subterms.push(bt->next());
    }
    if(bt->isSpecialVar()) {
      binder.specVar(bt->var(), *it);
    } else if(it->isSpecialVar()) {
      binder.specVar(it->var(), *bt);
    } else if(bt->isTerm()) {
      if(!it->isTerm()) {
	return false;
      }
      Term* s = bt->term();
      Term* t = it->term();
      if(s->functor()!=t->functor()) {
	return false;
      }
      if(bt->term()->shared() && it->term()->shared()) {
	if(bt->term()->ground() && *bt!=*it) {
	  return false;
	}
	if(s->weight() > t->weight()) {
	  return false;
	}
      }
      if(s->arity() > 0) {
	bt = s->args();
	it = t->args();
	continue;
      }
    } else {
      ASS(bt->isOrdinaryVar());
      if(!binder.bind(bt->var(), *it)) {
	return false;
      }
    }
    if(subterms.isEmpty()) {
      return true;
    }
    bt = subterms.pop();
    it = subterms.pop();
  }
}